

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

token * parse_enum_declaration(dmr_C *C,token *token,symbol *parent)

{
  byte *pbVar1;
  allocator *alloc;
  size_t *psVar2;
  symbol *psVar3;
  char cVar4;
  int iVar5;
  expression *expr_00;
  uint uVar6;
  int iVar7;
  position pVar8;
  dmr_C *pdVar9;
  symbol *sym;
  dmr_C *pdVar10;
  void *pvVar11;
  bool bVar12;
  dmr_C *in_RCX;
  dmr_C *pdVar13;
  global_symbols_t *pgVar14;
  ptr_list *local_a8;
  expression *expr;
  dmr_C *local_90;
  dmr_C *local_88;
  position local_80;
  dmr_C *local_78;
  dmr_C *local_70;
  undefined1 local_68 [24];
  dmr_C *pdStack_50;
  int local_48;
  int local_44;
  dmr_C *local_40;
  dmr_C *local_38;
  
  local_68._0_8_ = 0xffffffff;
  local_68._8_8_ = (dmr_C *)0x0;
  local_68._16_8_ = 1;
  pdStack_50 = (dmr_C *)0x0;
  pbVar1 = (byte *)((long)&parent->field_14 + 0xe);
  *pbVar1 = *pbVar1 | 0x10;
  (parent->field_14).field_2.ctype.base_type = &C->S->int_ctype;
  alloc = &C->ptrlist_allocator;
  local_48 = -1;
  local_88 = (dmr_C *)0x0;
  pdVar13 = (dmr_C *)0x0;
  local_44 = 1;
  pdVar10 = (dmr_C *)0x0;
  local_38 = (dmr_C *)0x0;
  pdVar9 = (dmr_C *)0x0;
  local_78 = C;
  local_70 = (dmr_C *)parent;
  for (; (*(uint *)token & 0x3f) == 2; token = *(token **)((long)token + 8)) {
    local_a8 = (ptr_list *)0x0;
    pVar8 = *(position *)((long)token + 8);
    local_90 = pdVar13;
    if (((*(uint *)pVar8 & 0x3f) == 0x11) && (*(uint *)((long)pVar8 + 0x10) == 0x3d)) {
      pVar8 = (position)
              dmrC_conditional_expression
                        (C,*(token **)((long)pVar8 + 8),(expression **)&stack0xffffffffffffff58);
      pdVar9 = (dmr_C *)dmrC_get_expression_value(C,(expression *)local_a8);
      pgVar14 = C->S;
      pdVar10 = (dmr_C *)&pgVar14->void_ctype;
      local_80 = pVar8;
      if (local_a8 == (ptr_list *)0x0) goto LAB_00118590;
      local_40 = pdVar9;
      if ((dmr_C *)local_a8->next_ != (dmr_C *)0x0) {
        pdVar10 = (dmr_C *)local_a8->next_;
      }
    }
    else {
      local_80 = pVar8;
      if (pdVar10 == (dmr_C *)0x0) {
        pdVar10 = (dmr_C *)&C->S->int_ctype;
      }
      else {
        iVar7 = dmrC_is_int_type(C->S,(symbol *)pdVar10);
        if (iVar7 == 0) {
          dmrC_error_die(C,token->pos,"can\'t increment the last enum member");
        }
        pdVar9 = (dmr_C *)((long)&pdVar9->target + 1);
      }
LAB_00118590:
      local_a8 = (ptr_list *)dmrC_alloc_expression(C,token->pos,1);
      (((anon_union_32_18_55d8ca1e_for_expression_5 *)local_a8->list_)->field_0).value =
           (unsigned_long_long)pdVar9;
      local_a8->next_ = (ptr_list *)pdVar10;
      pgVar14 = C->S;
      local_40 = pdVar9;
    }
    sym = dmrC_alloc_symbol(pgVar14,token->pos,3);
    in_RCX = (dmr_C *)0x10;
    dmrC_bind_symbol(C->S,sym,*(ident **)((long)token + 0x10),NS_SYMBOL);
    pbVar1 = (byte *)((long)&sym->field_14 + 0x1a);
    *pbVar1 = *pbVar1 & 0xf7;
    (sym->field_14).field_2.initializer = (expression *)local_a8;
    sym->field_0x2 = sym->field_0x2 | 0x10;
    (sym->field_14).field_2.ctype.base_type = (symbol *)local_70;
    ptrlist_add((ptr_list **)&(parent->field_14).field_2.symbol_list,sym,alloc);
    token = (token *)local_80;
    pgVar14 = C->S;
    psVar3 = &pgVar14->bad_ctype;
    if (local_38 != (dmr_C *)psVar3) {
      cVar4 = *(char *)&pdVar10->target;
      if (cVar4 == '\x03') {
        pdVar10 = (dmr_C *)(pdVar10->token_allocator).size_;
        cVar4 = *(char *)&pdVar10->target;
      }
      pdVar13 = pdVar10;
      if ((cVar4 == '\t') && (pdVar13 = local_38, pdVar10 != local_70)) {
        pdVar13 = (dmr_C *)(pdVar10->token_allocator).size_;
      }
      in_RCX = pdVar13;
      if ((((local_38 != (dmr_C *)0x0) && (in_RCX = local_38, pdVar13 != local_38)) &&
          (iVar7 = dmrC_is_int_type(pgVar14,(symbol *)local_38), in_RCX = (dmr_C *)psVar3,
          iVar7 != 0)) && (iVar7 = dmrC_is_int_type(pgVar14,(symbol *)pdVar13), iVar7 != 0)) {
        iVar7 = *(int *)&(pdVar13->ptrlist_allocator).freelist_;
        iVar5 = *(int *)&(local_38->ptrlist_allocator).freelist_;
        pdVar10 = pdVar13;
        if (((iVar7 <= iVar5) && (pdVar10 = local_38, iVar5 == iVar7)) &&
           (((pdVar13->ptrlist_allocator).total_bytes & 0x80) != 0)) {
          pdVar10 = pdVar13;
        }
        in_RCX = (dmr_C *)&pgVar14->int_ctype;
        if (local_78->target->bits_in_int <= *(int *)&(pdVar10->ptrlist_allocator).freelist_) {
          in_RCX = pdVar10;
        }
      }
      (local_70->token_allocator).size_ = (size_t)in_RCX;
      pgVar14 = local_78->S;
      local_38 = in_RCX;
      pdVar10 = pdVar13;
    }
    C = local_78;
    iVar7 = dmrC_is_int_type(pgVar14,(symbol *)local_38);
    pdVar13 = local_90;
    if (iVar7 != 0) {
      bVar12 = (long)local_40 < 0 && ((pdVar10->ptrlist_allocator).total_bytes & 0x80) == 0;
      in_RCX = (dmr_C *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar12);
      uVar6 = (uint)bVar12;
      iVar7 = -uVar6;
      bVar12 = (int)(local_48 + uVar6) < 0;
      if (local_48 == iVar7 || SBORROW4(local_48,iVar7) != bVar12) {
        if (SBORROW4(local_48,iVar7) == bVar12) {
          in_RCX = local_40;
          local_68._8_8_ = local_90;
          if (local_90 <= local_40) {
            pdVar13 = local_40;
            local_68._8_8_ = local_40;
          }
        }
        else {
          local_68._0_4_ = iVar7;
          pdVar13 = local_40;
          local_68._8_8_ = local_40;
          local_48 = iVar7;
        }
      }
      bVar12 = (int)(local_44 + uVar6) < 0;
      if (SBORROW4(local_44,iVar7) == bVar12) {
        if (local_44 == iVar7 || SBORROW4(local_44,iVar7) != bVar12) {
          in_RCX = local_40;
          pdStack_50 = local_88;
          if (local_40 <= local_88) {
            local_88 = local_40;
            pdStack_50 = local_40;
          }
        }
        else {
          local_68._16_4_ = iVar7;
          in_RCX = local_40;
          local_88 = local_40;
          pdStack_50 = local_40;
          local_44 = iVar7;
        }
      }
    }
    sym->endpos = token->pos;
    if (((*(uint *)token & 0x3f) != 0x11) || (*(uint *)((long)token + 0x10) != 0x2c)) break;
    pdVar9 = local_40;
  }
  pdVar10 = local_38;
  if (local_38 == (dmr_C *)0x0) {
    dmrC_sparse_error(C,token->pos,"bad enum definition");
    pdVar10 = (dmr_C *)&C->S->bad_ctype;
  }
  else {
    pgVar14 = C->S;
    iVar7 = dmrC_is_int_type(pgVar14,(symbol *)local_38);
    if ((iVar7 != 0) &&
       (iVar7 = type_is_ok(pdVar10,(symbol *)local_68,(Num *)(local_68 + 0x10),(Num *)in_RCX),
       iVar7 == 0)) {
      iVar7 = type_is_ok((dmr_C *)&pgVar14->int_ctype,(symbol *)local_68,(Num *)(local_68 + 0x10),
                         (Num *)in_RCX);
      pdVar10 = (dmr_C *)&pgVar14->int_ctype;
      if (iVar7 == 0) {
        iVar7 = type_is_ok((dmr_C *)&pgVar14->uint_ctype,(symbol *)local_68,(Num *)(local_68 + 0x10)
                           ,(Num *)in_RCX);
        pdVar10 = (dmr_C *)&pgVar14->uint_ctype;
        if (iVar7 == 0) {
          iVar7 = type_is_ok((dmr_C *)&pgVar14->long_ctype,(symbol *)local_68,
                             (Num *)(local_68 + 0x10),(Num *)in_RCX);
          pdVar10 = (dmr_C *)&pgVar14->long_ctype;
          if (iVar7 == 0) {
            iVar7 = type_is_ok((dmr_C *)&pgVar14->ulong_ctype,(symbol *)local_68,
                               (Num *)(local_68 + 0x10),(Num *)in_RCX);
            pdVar10 = (dmr_C *)&pgVar14->ulong_ctype;
            if (iVar7 == 0) {
              iVar7 = type_is_ok((dmr_C *)&pgVar14->llong_ctype,(symbol *)local_68,
                                 (Num *)(local_68 + 0x10),(Num *)in_RCX);
              pdVar10 = (dmr_C *)&pgVar14->llong_ctype;
              if (iVar7 == 0) {
                iVar7 = type_is_ok((dmr_C *)&pgVar14->ullong_ctype,(symbol *)local_68,
                                   (Num *)(local_68 + 0x10),(Num *)in_RCX);
                pdVar10 = (dmr_C *)&pgVar14->bad_ctype;
                if (iVar7 != 0) {
                  pdVar10 = (dmr_C *)&pgVar14->ullong_ctype;
                }
              }
            }
          }
        }
      }
    }
  }
  (local_70->token_allocator).size_ = (size_t)pdVar10;
  psVar2 = &(local_70->ptrlist_allocator).total_bytes;
  *psVar2 = *psVar2 | (pdVar10->ptrlist_allocator).total_bytes & 0x80;
  pbVar1 = (byte *)((long)&(local_70->ptrlist_allocator).freelist_ + 6);
  *pbVar1 = *pbVar1 & 0xef;
  ptrlist_forward_iterator
            ((ptr_list_iter *)&stack0xffffffffffffff58,
             (ptr_list *)(local_70->token_allocator).allocations);
  while (pvVar11 = ptrlist_iter_next((ptr_list_iter *)&stack0xffffffffffffff58),
        pvVar11 != (void *)0x0) {
    expr_00 = *(expression **)((long)pvVar11 + 0xb0);
    if ((*(char *)expr_00 == '\x01') &&
       ((expr_00->ctype->field_14).field_1.normal != *(int *)&(pdVar10->ptrlist_allocator).freelist_
       )) {
      dmrC_cast_value(C,expr_00,(symbol *)pdVar10,expr_00,expr_00->ctype);
    }
  }
  return (token *)(position)token;
}

Assistant:

static struct token *parse_enum_declaration(struct dmr_C *C, struct token *token, struct symbol *parent)
{
	unsigned long long lastval = 0;
	struct symbol *ctype = NULL, *base_type = NULL;
	Num upper = {-1, 0}, lower = {1, 0};

	parent->examined = 1;
	parent->ctype.base_type = &C->S->int_ctype;
	while (dmrC_token_type(token) == TOKEN_IDENT) {
		struct expression *expr = NULL;
		struct token *next = token->next;
		struct symbol *sym;

		if (dmrC_match_op(next, '=')) {
			next = dmrC_constant_expression(C, next->next, &expr);
			lastval = dmrC_get_expression_value(C, expr);
			ctype = &C->S->void_ctype;
			if (expr && expr->ctype)
				ctype = expr->ctype;
		} else if (!ctype) {
			ctype = &C->S->int_ctype;
		} else if (dmrC_is_int_type(C->S, ctype)) {
			lastval++;
		} else {
			dmrC_error_die(C, token->pos, "can't increment the last enum member");
		}

		if (!expr) {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);
			expr->value = lastval;
			expr->ctype = ctype;
		}

		sym = dmrC_alloc_symbol(C->S, token->pos, SYM_NODE);
		dmrC_bind_symbol(C->S, sym, token->ident, NS_SYMBOL);
		sym->ctype.modifiers &= ~MOD_ADDRESSABLE;
		sym->initializer = expr;
		sym->enum_member = 1;
		sym->ctype.base_type = parent;
		dmrC_add_symbol(C, &parent->symbol_list, sym);

		if (base_type != &C->S->bad_ctype) {
			if (ctype->type == SYM_NODE)
				ctype = ctype->ctype.base_type;
			if (ctype->type == SYM_ENUM) {
				if (ctype == parent)
					ctype = base_type;
				else 
					ctype = ctype->ctype.base_type;
			}
			/*
			 * base_type rules:
			 *  - if all enums are of the same type, then
			 *    the base_type is that type (two first
			 *    cases)
			 *  - if enums are of different types, they
			 *    all have to be integer types, and the
			 *    base type is at least "int_ctype".
			 *  - otherwise the base_type is "bad_ctype".
			 */
			if (!base_type) {
				base_type = ctype;
			} else if (ctype == base_type) {
				/* nothing */
			} else if (dmrC_is_int_type(C->S, base_type) && dmrC_is_int_type(C->S, ctype)) {
				base_type = bigger_enum_type(C, base_type, ctype);
			} else
				base_type = &C->S->bad_ctype;
			parent->ctype.base_type = base_type;
		}
		if (dmrC_is_int_type(C->S, base_type)) {
			Num v = {.y = lastval};
			if (ctype->ctype.modifiers & MOD_UNSIGNED)
				v.x = 0;
			else if ((long long)lastval >= 0)
				v.x = 0;
			else
				v.x = -1;
			upper_boundary(&upper, &v);
			lower_boundary(&lower, &v);
		}
		token = next;

		sym->endpos = token->pos;

		if (!dmrC_match_op(token, ','))
			break;
		token = token->next;
	}
	if (!base_type) {
		dmrC_sparse_error(C, token->pos, "bad enum definition");
		base_type = &C->S->bad_ctype;
	}
	else if (!dmrC_is_int_type(C->S, base_type))
                ; //base_type = base_type;
	else if (type_is_ok(C, base_type, &upper, &lower))
                ; //base_type = base_type;
	else if (type_is_ok(C, &C->S->int_ctype, &upper, &lower))
		base_type = &C->S->int_ctype;
	else if (type_is_ok(C, &C->S->uint_ctype, &upper, &lower))
		base_type = &C->S->uint_ctype;
	else if (type_is_ok(C, &C->S->long_ctype, &upper, &lower))
		base_type = &C->S->long_ctype;
	else if (type_is_ok(C, &C->S->ulong_ctype, &upper, &lower))
		base_type = &C->S->ulong_ctype;
	else if (type_is_ok(C, &C->S->llong_ctype, &upper, &lower))
		base_type = &C->S->llong_ctype;
	else if (type_is_ok(C, &C->S->ullong_ctype, &upper, &lower))
		base_type = &C->S->ullong_ctype;
	else
		base_type = &C->S->bad_ctype;
	parent->ctype.base_type = base_type;
	parent->ctype.modifiers |= (base_type->ctype.modifiers & MOD_UNSIGNED);
	parent->examined = 0;

	cast_enum_list(C, parent->symbol_list, base_type);

	return token;
}